

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minify_tests.c
# Opt level: O3

void cjson_minify_should_remove_spaces(void)

{
  char *json;
  
  json = (char *)malloc(0x15);
  if (json == (char *)0x0) {
    UnityFail(" Expected Non-NULL",0x3f);
    _DAT_00000010 = 0x7d202020;
    DAT_00000000 = '{';
    DAT_00000000_1._0_1_ = ' ';
    DAT_00000000_1._1_1_ = '\"';
    DAT_00000000_1._2_1_ = 'k';
    DAT_00000000_1._3_1_ = 'e';
    DAT_00000000_1._4_1_ = 'y';
    DAT_00000000_1._5_1_ = '\"';
    DAT_00000000_1._6_1_ = ':';
    uRam0000000000000008 = 0x6575727409;
    _DAT_0000000d = 0x200a0d;
  }
  else {
    builtin_strncpy(json,"{ \"key\":\ttrue\r\n    }",0x15);
    cJSON_Minify(json);
  }
  UnityAssertEqualString("{\"key\":true}",json,(char *)0x0,0x43);
  free(json);
  return;
}

Assistant:

static void cjson_minify_should_remove_spaces(void)
{
    const char to_minify[] = "{ \"key\":\ttrue\r\n    }";

    char* minified = (char*) malloc(sizeof(to_minify));
    TEST_ASSERT_NOT_NULL(minified);
    strcpy(minified, to_minify);

    cJSON_Minify(minified);
    TEST_ASSERT_EQUAL_STRING("{\"key\":true}", minified);

    free(minified);
}